

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O3

void Mvc_CoverCommonCube(Mvc_Cover_t *pCover,Mvc_Cube_t *pComCube)

{
  uint uVar1;
  uint uVar2;
  Mvc_Cube_t *pMVar3;
  byte bVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  bool bVar8;
  
  uVar1 = *(uint *)&pComCube->field_0x8;
  uVar7 = uVar1 & 0xffffff;
  bVar4 = (byte)(uVar1 >> 0x18);
  if ((ulong)uVar7 == 1) {
    pComCube->pData[0] = 0xffffffff;
    *(uint *)&pComCube->field_0x14 = 0xffffffff >> (bVar4 & 0x1f);
  }
  else {
    uVar2 = 0xffffffff >> (bVar4 & 0x1f);
    if (uVar7 == 0) {
      pComCube->pData[0] = uVar2;
    }
    else {
      pComCube->pData[uVar7] = uVar2;
      memset(pComCube->pData,0xff,(ulong)(uVar1 * 4 & 0x3fffffc));
    }
  }
  pMVar3 = (pCover->lCubes).pHead;
  if (pMVar3 != (Mvc_Cube_t *)0x0) {
    do {
      if (uVar7 == 0) {
        pComCube->pData[0] = pComCube->pData[0] & pMVar3->pData[0];
      }
      else {
        lVar5 = (ulong)(uVar1 & 0xffffff) + 4;
        if (uVar7 == 1) {
          pComCube->pData[0] = pComCube->pData[0] & pMVar3->pData[0];
          *(uint *)&pComCube->field_0x14 =
               *(uint *)&pComCube->field_0x14 & *(uint *)&pMVar3->field_0x14;
        }
        else {
          do {
            pComCube->pData[lVar5 + -4] = pComCube->pData[lVar5 + -4] & pMVar3->pData[lVar5 + -4];
            lVar6 = lVar5 + -4;
            bVar8 = lVar5 != 4;
            lVar5 = lVar5 + -1;
          } while (bVar8 && -1 < lVar6);
        }
      }
      pMVar3 = pMVar3->pNext;
    } while (pMVar3 != (Mvc_Cube_t *)0x0);
  }
  return;
}

Assistant:

void Mvc_CoverCommonCube( Mvc_Cover_t * pCover, Mvc_Cube_t * pComCube )
{
    Mvc_Cube_t * pCube;
    // clean the support
    Mvc_CubeBitFill( pComCube );
    // collect the support
    Mvc_CoverForEachCube( pCover, pCube )
        Mvc_CubeBitAnd( pComCube, pComCube, pCube );
}